

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O1

JsValueRef
WScriptJsrt::ReceiveBroadcastCallback
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  JsRef pvVar1;
  JsErrorCode JVar2;
  RuntimeThreadLocalData *pRVar3;
  JsValueRef local_28;
  JsValueRef returnValue;
  
  local_28 = (JsValueRef)0x0;
  JVar2 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetUndefinedValue)(&local_28);
  if ((1 < argumentCount) && (JVar2 == JsNoError)) {
    pRVar3 = GetRuntimeThreadLocalData();
    if (pRVar3->threadData != (RuntimeThreadData *)0x0) {
      pvVar1 = pRVar3->threadData->receiveBroadcastCallbackFunc;
      if (pvVar1 != (JsRef)0x0) {
        (*ChakraRTInterface::m_jsApiHooks.pfJsrtRelease)(pvVar1,(uint *)0x0);
      }
      pRVar3->threadData->receiveBroadcastCallbackFunc = arguments[1];
      (*ChakraRTInterface::m_jsApiHooks.pfJsrtAddRef)
                (pRVar3->threadData->receiveBroadcastCallbackFunc,(uint *)0x0);
    }
  }
  return local_28;
}

Assistant:

JsValueRef __stdcall WScriptJsrt::ReceiveBroadcastCallback(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    HRESULT hr = E_FAIL;
    JsValueRef returnValue = JS_INVALID_REFERENCE;
    JsErrorCode errorCode = JsNoError;

    IfJsrtErrorSetGo(ChakraRTInterface::JsGetUndefinedValue(&returnValue));

    if (argumentCount > 1)
    {
        auto& threadData = GetRuntimeThreadLocalData().threadData;
        if (threadData)
        {
            if (threadData->receiveBroadcastCallbackFunc)
            {
                ChakraRTInterface::JsRelease(threadData->receiveBroadcastCallbackFunc, nullptr);
            }
            threadData->receiveBroadcastCallbackFunc = arguments[1];
            ChakraRTInterface::JsAddRef(threadData->receiveBroadcastCallbackFunc, nullptr);
        }
    }

Error:
    return returnValue;
}